

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O0

LY_ERR ly_getutf8(char **input,uint32_t *utf8_char,size_t *bytes_read)

{
  ulong local_48;
  uint64_t i_1;
  uint64_t i;
  size_t len;
  uint32_t aux;
  uint32_t c;
  size_t *bytes_read_local;
  uint32_t *utf8_char_local;
  char **input_local;
  
  len._4_4_ = (uint)**input;
  if ((len._4_4_ & 0x80) == 0) {
    i = 1;
    if ((0x1f < len._4_4_) || (((len._4_4_ == 9 || (len._4_4_ == 10)) || (len._4_4_ == 0xd)))) {
LAB_0010eef9:
      *utf8_char = len._4_4_;
      *input = *input + i;
      if (bytes_read != (size_t *)0x0) {
        *bytes_read = i;
      }
      return LY_SUCCESS;
    }
  }
  else if ((len._4_4_ & 0xe0) == 0xc0) {
    i = 2;
    if ((((int)(*input)[1] & 0xc0U) == 0x80) &&
       (len._4_4_ = (len._4_4_ & 0x1f) << 6 | (int)(*input)[1] & 0x3fU, 0x7f < len._4_4_))
    goto LAB_0010eef9;
  }
  else if ((len._4_4_ & 0xf0) == 0xe0) {
    i = 3;
    len._4_4_ = len._4_4_ & 0xf;
    for (i_1 = 1; i_1 < 3; i_1 = i_1 + 1) {
      if (((int)(*input)[i_1] & 0xc0U) != 0x80) goto LAB_0010ef2b;
      len._4_4_ = len._4_4_ << 6 | (int)(*input)[i_1] & 0x3fU;
    }
    if ((0x7ff < len._4_4_) &&
       (((len._4_4_ < 0xd800 || (0xdfff < len._4_4_)) && (len._4_4_ < 0xfffe)))) goto LAB_0010eef9;
  }
  else if ((len._4_4_ & 0xf8) == 0xf0) {
    i = 4;
    len._4_4_ = len._4_4_ & 7;
    for (local_48 = 1; local_48 < 4; local_48 = local_48 + 1) {
      if (((int)(*input)[local_48] & 0xc0U) != 0x80) goto LAB_0010ef2b;
      len._4_4_ = len._4_4_ << 6 | (int)(*input)[local_48] & 0x3fU;
    }
    if ((0xfff < len._4_4_) && (len._4_4_ < 0x110000)) goto LAB_0010eef9;
  }
LAB_0010ef2b:
  if (bytes_read != (size_t *)0x0) {
    *bytes_read = 0;
  }
  return LY_EINVAL;
}

Assistant:

LY_ERR
ly_getutf8(const char **input, uint32_t *utf8_char, size_t *bytes_read)
{
    uint32_t c, aux;
    size_t len;

    c = (*input)[0];

    if (!(c & 0x80)) {
        /* one byte character */
        len = 1;

        if ((c < 0x20) && (c != 0x9) && (c != 0xa) && (c != 0xd)) {
            goto error;
        }
    } else if ((c & 0xe0) == 0xc0) {
        /* two bytes character */
        len = 2;

        aux = (*input)[1];
        if ((aux & 0xc0) != 0x80) {
            goto error;
        }
        c = ((c & 0x1f) << 6) | (aux & 0x3f);

        if (c < 0x80) {
            goto error;
        }
    } else if ((c & 0xf0) == 0xe0) {
        /* three bytes character */
        len = 3;

        c &= 0x0f;
        for (uint64_t i = 1; i <= 2; i++) {
            aux = (*input)[i];
            if ((aux & 0xc0) != 0x80) {
                goto error;
            }

            c = (c << 6) | (aux & 0x3f);
        }

        if ((c < 0x800) || ((c > 0xd7ff) && (c < 0xe000)) || (c > 0xfffd)) {
            goto error;
        }
    } else if ((c & 0xf8) == 0xf0) {
        /* four bytes character */
        len = 4;

        c &= 0x07;
        for (uint64_t i = 1; i <= 3; i++) {
            aux = (*input)[i];
            if ((aux & 0xc0) != 0x80) {
                goto error;
            }

            c = (c << 6) | (aux & 0x3f);
        }

        if ((c < 0x1000) || (c > 0x10ffff)) {
            goto error;
        }
    } else {
        goto error;
    }

    (*utf8_char) = c;
    (*input) += len;
    if (bytes_read) {
        (*bytes_read) = len;
    }
    return LY_SUCCESS;

error:
    if (bytes_read) {
        (*bytes_read) = 0;
    }
    return LY_EINVAL;
}